

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

CuePoint * __thiscall mkvparser::Cues::GetNext(Cues *this,CuePoint *pCurr)

{
  long lVar1;
  long lVar2;
  longlong lVar3;
  CuePoint *in_RSI;
  long in_RDI;
  CuePoint *pNext;
  CuePoint **pp;
  long index;
  CuePoint *local_8;
  
  if ((((in_RSI == (CuePoint *)0x0) || (lVar3 = CuePoint::GetTimeCode(in_RSI), lVar3 < 0)) ||
      (*(long *)(in_RDI + 0x28) == 0)) || (*(long *)(in_RDI + 0x30) < 1)) {
    local_8 = (CuePoint *)0x0;
  }
  else {
    lVar1 = in_RSI->m_index;
    if (lVar1 < *(long *)(in_RDI + 0x30)) {
      lVar2 = *(long *)(in_RDI + 0x28);
      if ((lVar2 == 0) || (*(CuePoint **)(lVar2 + lVar1 * 8) != in_RSI)) {
        local_8 = (CuePoint *)0x0;
      }
      else if (lVar1 + 1 < *(long *)(in_RDI + 0x30)) {
        local_8 = *(CuePoint **)(lVar2 + (lVar1 + 1) * 8);
        if ((local_8 == (CuePoint *)0x0) || (lVar3 = CuePoint::GetTimeCode(local_8), lVar3 < 0)) {
          local_8 = (CuePoint *)0x0;
        }
      }
      else {
        local_8 = (CuePoint *)0x0;
      }
    }
    else {
      local_8 = (CuePoint *)0x0;
    }
  }
  return local_8;
}

Assistant:

const CuePoint* Cues::GetNext(const CuePoint* pCurr) const {
  if (pCurr == NULL || pCurr->GetTimeCode() < 0 || m_cue_points == NULL ||
      m_count < 1) {
    return NULL;
  }

  long index = pCurr->m_index;
  if (index >= m_count)
    return NULL;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL || pp[index] != pCurr)
    return NULL;

  ++index;

  if (index >= m_count)
    return NULL;

  CuePoint* const pNext = pp[index];

  if (pNext == NULL || pNext->GetTimeCode() < 0)
    return NULL;

  return pNext;
}